

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

StatementNode * __thiscall DL::Parser::gr_array(Parser *this)

{
  pointer ppDVar1;
  pointer ppDVar2;
  StatementNode *pSVar3;
  vector_t<DataNode_*> local_38;
  
  pSVar3 = (StatementNode *)operator_new(0x38);
  (pSVar3->Name)._M_dataplus._M_p = (pointer)&(pSVar3->Name).field_2;
  (pSVar3->Name)._M_string_length = 0;
  (pSVar3->Name).field_2._M_local_buf[0] = '\0';
  (pSVar3->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar3->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar3->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_replace((ulong)pSVar3,0,(char *)0x0,0x111730);
  gr_data_list(&local_38,this);
  ppDVar1 = (pSVar3->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppDVar2 = (pSVar3->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pSVar3->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pSVar3->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (pSVar3->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (ppDVar1 != (pointer)0x0) {
    operator_delete(ppDVar1,(long)ppDVar2 - (long)ppDVar1);
    if (local_38.super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return pSVar3;
}

Assistant:

StatementNode* Parser::gr_array()
{
	StatementNode* node = new StatementNode;

	node->Name  = "";
	node->Nodes = gr_data_list();

	return node;
}